

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

uint8_t * lj_err_register_mcode(void *base,size_t sz,uint8_t *info)

{
  void *in_RDX;
  int in_ESI;
  int in_EDI;
  void **handler;
  
  memcpy(in_RDX,"\x1c",0x3c);
  *(code **)((long)in_RDX + 0x12) = err_unwind_jit;
  *(int *)((long)in_RDX + 0x2c) = (in_ESI + -0x3c) - ((int)in_RDX - in_EDI);
  __register_frame(in_RDX);
  return (uint8_t *)((long)in_RDX + 0x3c);
}

Assistant:

uint8_t *lj_err_register_mcode(void *base, size_t sz, uint8_t *info)
{
  void **handler;
  memcpy(info, err_frame_jit_template, sizeof(err_frame_jit_template));
  handler = (void *)err_unwind_jit;
  memcpy(info + ERR_FRAME_JIT_OFS_HANDLER, &handler, sizeof(handler));
  *(uint32_t *)(info + ERR_FRAME_JIT_OFS_CODE_SIZE) =
    (uint32_t)(sz - sizeof(err_frame_jit_template) - (info - (uint8_t *)base));
  __register_frame(info + ERR_FRAME_JIT_OFS_REGISTER);
#ifdef LUA_USE_ASSERT
  {
    struct dwarf_eh_bases ehb;
    lj_assertX(_Unwind_Find_FDE(info + sizeof(err_frame_jit_template)+1, &ehb),
	       "bad JIT unwind table registration");
  }
#endif
  return info + sizeof(err_frame_jit_template);
}